

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_quadrature_mirror_filter_banks.cc
# Opt level: O0

bool __thiscall
sptk::PseudoQuadratureMirrorFilterBanks::Run
          (PseudoQuadratureMirrorFilterBanks *this,double input,
          vector<double,_std::allocator<double>_> *output,Buffer *buffer)

{
  bool bVar1;
  size_type sVar2;
  Buffer *pBVar3;
  reference ppBVar4;
  AllZeroDigitalFilter *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  int k;
  iterator itr_1;
  iterator itr;
  vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<sptk::AllZeroDigitalFilter::Buffer_**,_std::vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>_>
  *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  int local_58;
  iterator in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc0;
  iterator in_stack_ffffffffffffffc8;
  iterator in_stack_ffffffffffffffd0;
  bool local_1;
  
  if ((((*(byte *)(in_RDI + 0x20) & 1) == 0) ||
      (in_RSI == (vector<double,_std::allocator<double>_> *)0x0)) ||
     (in_RDX == (AllZeroDigitalFilter *)0x0)) {
    local_1 = false;
  }
  else {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (sVar2 != (long)*(int *)(in_RDI + 8)) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    sVar2 = std::
            vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
            ::size((vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
                    *)&in_RDX->num_filter_order_);
    if (sVar2 != (long)*(int *)(in_RDI + 8)) {
      in_stack_ffffffffffffffd0 =
           std::
           vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
           ::begin(in_stack_ffffffffffffff68);
      while( true ) {
        in_stack_ffffffffffffffc8 =
             std::
             vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
             ::end(in_stack_ffffffffffffff68);
        bVar1 = __gnu_cxx::operator!=
                          (in_stack_ffffffffffffff70,
                           (__normal_iterator<sptk::AllZeroDigitalFilter::Buffer_**,_std::vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>_>
                            *)in_stack_ffffffffffffff68);
        if (!bVar1) break;
        ppBVar4 = __gnu_cxx::
                  __normal_iterator<sptk::AllZeroDigitalFilter::Buffer_**,_std::vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>_>
                  ::operator*((__normal_iterator<sptk::AllZeroDigitalFilter::Buffer_**,_std::vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>_>
                               *)&stack0xffffffffffffffd0);
        if (*ppBVar4 != (Buffer *)0x0) {
          (*(*ppBVar4)->_vptr_Buffer[1])();
        }
        ppBVar4 = __gnu_cxx::
                  __normal_iterator<sptk::AllZeroDigitalFilter::Buffer_**,_std::vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>_>
                  ::operator*((__normal_iterator<sptk::AllZeroDigitalFilter::Buffer_**,_std::vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>_>
                               *)&stack0xffffffffffffffd0);
        *ppBVar4 = (Buffer *)0x0;
        __gnu_cxx::
        __normal_iterator<sptk::AllZeroDigitalFilter::Buffer_**,_std::vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>_>
        ::operator++((__normal_iterator<sptk::AllZeroDigitalFilter::Buffer_**,_std::vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>_>
                      *)&stack0xffffffffffffffd0);
      }
      std::
      vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
      ::resize((vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
                *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      in_stack_ffffffffffffffc0 =
           std::
           vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
           ::begin(in_stack_ffffffffffffff68);
      while( true ) {
        in_stack_ffffffffffffffb8 =
             std::
             vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
             ::end(in_stack_ffffffffffffff68);
        bVar1 = __gnu_cxx::operator!=
                          (in_stack_ffffffffffffff70,
                           (__normal_iterator<sptk::AllZeroDigitalFilter::Buffer_**,_std::vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>_>
                            *)in_stack_ffffffffffffff68);
        if (!bVar1) break;
        pBVar3 = (Buffer *)operator_new(0x20);
        AllZeroDigitalFilter::Buffer::Buffer((Buffer *)0x1079c4);
        ppBVar4 = __gnu_cxx::
                  __normal_iterator<sptk::AllZeroDigitalFilter::Buffer_**,_std::vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>_>
                  ::operator*((__normal_iterator<sptk::AllZeroDigitalFilter::Buffer_**,_std::vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>_>
                               *)&stack0xffffffffffffffc0);
        *ppBVar4 = pBVar3;
        __gnu_cxx::
        __normal_iterator<sptk::AllZeroDigitalFilter::Buffer_**,_std::vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>_>
        ::operator++((__normal_iterator<sptk::AllZeroDigitalFilter::Buffer_**,_std::vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>_>
                      *)&stack0xffffffffffffffc0);
      }
    }
    for (local_58 = 0; local_58 < *(int *)(in_RDI + 8); local_58 = local_58 + 1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0x28),(long)local_58);
      std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_58);
      std::
      vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
      ::operator[]((vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
                    *)&in_RDX->num_filter_order_,(long)local_58);
      bVar1 = AllZeroDigitalFilter::Run
                        (in_RDX,(vector<double,_std::allocator<double>_> *)
                                in_stack_ffffffffffffffd0._M_current,
                         (double)in_stack_ffffffffffffffc8._M_current,
                         (double *)in_stack_ffffffffffffffc0._M_current,
                         (Buffer *)in_stack_ffffffffffffffb8._M_current);
      if (!bVar1) {
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool PseudoQuadratureMirrorFilterBanks::Run(
    double input, std::vector<double>* output,
    PseudoQuadratureMirrorFilterBanks::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || output == nullptr || buffer == nullptr) return false;

  // Prepare memories.
  if (output->size() != static_cast<std::size_t>(num_subband_)) {
    output->resize(num_subband_);
  }
  if (buffer->buffer_for_all_zero_filter_.size() !=
      static_cast<std::size_t>(num_subband_)) {
    for (std::vector<AllZeroDigitalFilter::Buffer*>::iterator itr(
             buffer->buffer_for_all_zero_filter_.begin());
         itr != buffer->buffer_for_all_zero_filter_.end(); ++itr) {
      delete (*itr);
      *itr = NULL;
    }

    buffer->buffer_for_all_zero_filter_.resize(num_subband_);
    for (std::vector<AllZeroDigitalFilter::Buffer*>::iterator itr(
             buffer->buffer_for_all_zero_filter_.begin());
         itr != buffer->buffer_for_all_zero_filter_.end(); ++itr) {
      *itr = new AllZeroDigitalFilter::Buffer();
    }
  }

  for (int k(0); k < num_subband_; ++k) {
    if (!all_zero_filter_.Run(filter_banks_[k], input, &((*output)[k]),
                              buffer->buffer_for_all_zero_filter_[k])) {
      return false;
    }
  }

  return true;
}